

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val-from-text.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonValBuilder::_handleVal<long_long_const&>
          (JsonValBuilder *this,TextLocation *loc,longlong *args)

{
  Size SVar1;
  TextLocation loc_00;
  bool bVar2;
  Index IVar3;
  Index lineNumber;
  Index colNumber;
  reference pvVar4;
  _tStackFrame *p_Var5;
  _tStackFrame *p_Var6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>_>_>
  local_88;
  unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
  local_50;
  undefined4 local_44;
  TextLocation local_40;
  unique_ptr<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>_>
  local_28;
  Up jsonVal;
  longlong *args_local;
  TextLocation *loc_local;
  JsonValBuilder *this_local;
  
  jsonVal._M_t.
  super___uniq_ptr_impl<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_*,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>_>
  .
  super__Head_base<0UL,_const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>,_true,_true>
        )(__uniq_ptr_data<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>,_true,_true>
          )args;
  IVar3 = TextLocation::offset(loc);
  SVar1 = this->_baseOffset;
  lineNumber = TextLocation::lineNumber(loc);
  colNumber = TextLocation::columnNumber(loc);
  TextLocation::TextLocation(&local_40,IVar3 + SVar1,lineNumber,colNumber);
  loc_00._lineNumber = local_40._lineNumber;
  loc_00._offset = local_40._offset;
  loc_00._colNumber = local_40._colNumber;
  createJsonVal((longlong)&local_28,loc_00);
  bVar2 = std::
          vector<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
          ::empty(&this->_stack);
  if (bVar2) {
    std::
    unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>
    ::operator=((unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>
                 *)&this->_jsonVal,&local_28);
    local_44 = 1;
  }
  else {
    pvVar4 = std::
             vector<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
             ::back(&this->_stack);
    if (pvVar4->state == InArray) {
      p_Var5 = _stackTop(this);
      std::
      unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>
      ::
      unique_ptr<yactfr::internal::JsonScalarVal<long_long,(yactfr::internal::JsonValKind)2>const,std::default_delete<yactfr::internal::JsonScalarVal<long_long,(yactfr::internal::JsonValKind)2>const>,void>
                ((unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>
                  *)&local_50,&local_28);
      std::
      vector<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>
      ::push_back(&p_Var5->arrayValCont,(value_type *)&local_50);
      std::
      unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
      ::~unique_ptr(&local_50);
    }
    else {
      if (pvVar4->state != InObj) {
        abort();
      }
      p_Var5 = _stackTop(this);
      p_Var6 = _stackTop(this);
      std::
      make_pair<std::__cxx11::string,std::unique_ptr<yactfr::internal::JsonScalarVal<long_long,(yactfr::internal::JsonValKind)2>const,std::default_delete<yactfr::internal::JsonScalarVal<long_long,(yactfr::internal::JsonValKind)2>const>>>
                (&local_88,&p_Var6->lastObjKey,&local_28);
      std::
      map<std::__cxx11::string,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>
      ::
      insert<std::pair<std::__cxx11::string,std::unique_ptr<yactfr::internal::JsonScalarVal<long_long,(yactfr::internal::JsonValKind)2>const,std::default_delete<yactfr::internal::JsonScalarVal<long_long,(yactfr::internal::JsonValKind)2>const>>>>
                ((map<std::__cxx11::string,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>
                  *)&p_Var5->objValCont,&local_88);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>_>_>
      ::~pair(&local_88);
    }
    local_44 = 0;
  }
  std::
  unique_ptr<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>_>
  ::~unique_ptr(&local_28);
  return;
}

Assistant:

void _handleVal(const TextLocation& loc, ArgTs&&... args)
    {
        auto jsonVal = createJsonVal(std::forward<ArgTs>(args)..., TextLocation {
            loc.offset() + _baseOffset, loc.lineNumber(), loc.columnNumber()
        });

        if (_stack.empty()) {
            _jsonVal = std::move(jsonVal);
            return;
        }

        switch (_stack.back().state) {
        case _tState::InArray:
            this->_stackTop().arrayValCont.push_back(std::move(jsonVal));
            break;

        case _tState::InObj:
             // safe to move `lastObjKey`: only used once
            this->_stackTop().objValCont.insert(std::make_pair(std::move(this->_stackTop().lastObjKey),
                                                               std::move(jsonVal)));
            break;

        default:
            std::abort();
        }
    }